

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O2

int rtr_bgpsec_generate_signature
              (rtr_bgpsec *data,uint8_t *private_key,rtr_signature_seg **new_signature)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  rtr_signature_seg *prVar4;
  size_t sVar5;
  uint8_t *bytes;
  stream *s;
  long in_FS_OFFSET;
  EC_KEY *local_48;
  uchar *hash_result;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hash_result = (uchar *)0x0;
  local_48 = (EC_KEY *)0x0;
  iVar2 = -9;
  if ((((data != (rtr_bgpsec *)0x0) && (private_key != (uint8_t *)0x0)) &&
      (data->path != (rtr_secure_path_seg *)0x0)) && (*new_signature == (rtr_signature_seg *)0x0)) {
    iVar2 = rtr_bgpsec_has_algorithm_suite(data->alg);
    if (iVar2 == -1) {
      iVar2 = -6;
    }
    else {
      uVar1 = data->nlri->afi;
      if ((ushort)(uVar1 - 1) < 2) {
        if (data->sigs_len + 1 == (uint)data->path_len) {
          iVar3 = load_private_key(&local_48,private_key);
          iVar2 = -3;
          if ((iVar3 == 0) && (iVar3 = ECDSA_size((EC_KEY *)local_48), iVar3 != 0)) {
            s = (stream *)0x0;
            prVar4 = rtr_bgpsec_new_signature_seg((uint8_t *)0x0,(uint16_t)iVar3,(uint8_t *)0x0);
            *new_signature = prVar4;
            if (prVar4 == (rtr_signature_seg *)0x0) {
              iVar2 = -1;
            }
            else {
              prVar4->sig_len = 0;
              sVar5 = req_stream_size(data,SIGNING);
              s = init_stream((uint16_t)sVar5);
              iVar2 = align_byte_sequence(data,s,SIGNING);
              if (iVar2 == 0) {
                bytes = get_stream_start(s);
                sVar5 = get_stream_size(s);
                iVar2 = hash_byte_sequence(bytes,sVar5,data->alg,&hash_result);
                if (iVar2 == 0) {
                  iVar2 = sign_byte_sequence(hash_result,local_48,data->alg,*new_signature);
                }
                if (hash_result != (uchar *)0x0) {
                  lrtr_free(hash_result);
                }
              }
            }
          }
          else {
            s = (stream *)0x0;
          }
          if ((*new_signature != (rtr_signature_seg *)0x0) && (iVar2 == -5)) {
            rtr_bgpsec_free_signatures(*new_signature);
          }
          if (s != (stream *)0x0) {
            free_stream(s);
          }
          if (local_48 != (EC_KEY *)0x0) {
            EC_KEY_free((EC_KEY *)local_48);
          }
        }
        else {
          iVar2 = -8;
        }
      }
      else {
        iVar2 = -7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int rtr_bgpsec_generate_signature(const struct rtr_bgpsec *data, uint8_t *private_key,
				  struct rtr_signature_seg **new_signature)
{
	/* The signature generation result. */
	enum rtr_bgpsec_rtvals retval = 0;

	/* The resulting hash. */
	unsigned char *hash_result = NULL;

	/* The required size for the signature */
	int req_sig_size = 0;

	/* A stream that holds the data that is hashed */
	struct stream *s = NULL;

	/* Total size of required space for the stream */
	unsigned int stream_size = 0;

	/* OpenSSL private key structure. */
	EC_KEY *priv_key = NULL;

	/* Check, if the parameters are not NULL except for *new_signature,
	 * which must be NULL.
	 */
	if (!data || !data->path || !private_key || *new_signature)
		return RTR_BGPSEC_INVALID_ARGUMENTS;

	/* Make sure the algorithm suite is supported. */
	if (rtr_bgpsec_has_algorithm_suite(data->alg) == RTR_BGPSEC_ERROR)
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;

	/* Check, if the AFI is usable with BGPsec */
	if ((data->nlri->afi != BGPSEC_IPV4) && (data->nlri->afi != BGPSEC_IPV6))
		return RTR_BGPSEC_UNSUPPORTED_AFI;

	/* Check, if there is one more secure path segment than there are
	 * signature segments. This is because the next signature is generated
	 * for a secure path segment, that was not signed yet (the last appended
	 * secure path segment).
	 */
	if (data->path_len != (data->sigs_len + 1))
		return RTR_BGPSEC_WRONG_SEGMENT_COUNT;

	/* Load the private key from buffer into OpenSSL structure. */
	retval = load_private_key(&priv_key, private_key);

	if (retval != RTR_BGPSEC_SUCCESS) {
		retval = RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
		goto err;
	}

	/* Allocate the needed space for the signature */
	req_sig_size = ECDSA_size(priv_key);
	if (req_sig_size == 0) {
		retval = RTR_BGPSEC_LOAD_PRIV_KEY_ERROR;
		goto err;
	}

	*new_signature = rtr_bgpsec_new_signature_seg(NULL, req_sig_size, NULL);
	if (!(*new_signature)) {
		retval = RTR_BGPSEC_ERROR;
		goto err;
	}

	/* The function call above expects the exact size of the signature.
	 * Because the signature was not generated yet, we pass the maximum
	 * possible length to it so enough space is allocated. Then, the
	 * sig_len field is set to 0, since the signature does not exist yet.
	 * This is a rather hacky workaround and might get changed in the
	 * future.
	 */
	(*new_signature)->sig_len = 0;

	/* Calculate the required stream size and initialize the stream */
	stream_size = req_stream_size(data, SIGNING);
	s = init_stream(stream_size);

	/* Align the bytes to prepare them for hashing. */
	retval = align_byte_sequence(data, s, SIGNING);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Hash the aligned bytes. */
	uint8_t *curr = get_stream_start(s);

	retval = hash_byte_sequence(curr, get_stream_size(s), data->alg, &hash_result);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Sign the hash depending on the algorithm suite. */
	retval = sign_byte_sequence(hash_result, priv_key, data->alg, *new_signature);

err:
	if (hash_result)
		lrtr_free(hash_result);
	if (*new_signature && (retval == RTR_BGPSEC_SIGNING_ERROR))
		rtr_bgpsec_free_signatures(*new_signature);
	if (s)
		free_stream(s);
	if (priv_key) {
		EC_KEY_free(priv_key);
		priv_key = NULL;
	}

	return retval;
}